

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

void gflags::anon_unknown_2::FindMatchingFlags
               (vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                *all_flags,CompletionOptions *options,string *match_token,
               set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
               *all_matches,string *longest_common_prefix)

{
  char cVar1;
  bool bVar2;
  reference flag;
  pointer pCVar3;
  ulong uVar4;
  char *pcVar5;
  ulong local_68;
  size_type pos;
  reference local_50;
  __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  local_48;
  __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
  local_40;
  const_iterator it;
  bool first_match;
  string *longest_common_prefix_local;
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  *all_matches_local;
  string *match_token_local;
  CompletionOptions *options_local;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *all_flags_local
  ;
  
  std::
  set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
  ::clear(all_matches);
  it._M_current._7_1_ = 1;
  local_40._M_current =
       (CommandLineFlagInfo *)
       std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::begin
                 (all_flags);
  do {
    local_48._M_current =
         (CommandLineFlagInfo *)
         std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::end
                   (all_flags);
    bVar2 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar2) {
      return;
    }
    flag = __gnu_cxx::
           __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
           ::operator*(&local_40);
    bVar2 = DoesSingleFlagMatch(flag,options,match_token);
    if (bVar2) {
      local_50 = __gnu_cxx::
                 __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                 ::operator*(&local_40);
      std::
      set<const_gflags::CommandLineFlagInfo_*,_std::less<const_gflags::CommandLineFlagInfo_*>,_std::allocator<const_gflags::CommandLineFlagInfo_*>_>
      ::insert(all_matches,&local_50);
      if ((it._M_current._7_1_ & 1) == 0) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          __gnu_cxx::
          __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
          ::operator->(&local_40);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_68 = 0;
            while( true ) {
              uVar4 = std::__cxx11::string::size();
              bVar2 = false;
              if (local_68 < uVar4) {
                __gnu_cxx::
                __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                ::operator->(&local_40);
                uVar4 = std::__cxx11::string::size();
                bVar2 = false;
                if (local_68 < uVar4) {
                  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)longest_common_prefix);
                  cVar1 = *pcVar5;
                  pCVar3 = __gnu_cxx::
                           __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                           ::operator->(&local_40);
                  pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pCVar3);
                  bVar2 = cVar1 == *pcVar5;
                }
              }
              if (!bVar2) break;
              local_68 = local_68 + 1;
            }
            std::__cxx11::string::erase((ulong)longest_common_prefix,local_68);
            goto LAB_001529b2;
          }
        }
        std::__cxx11::string::clear();
      }
      else {
        it._M_current._7_1_ = 0;
        pCVar3 = __gnu_cxx::
                 __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
                 ::operator->(&local_40);
        std::__cxx11::string::operator=((string *)longest_common_prefix,(string *)pCVar3);
      }
    }
LAB_001529b2:
    __gnu_cxx::
    __normal_iterator<const_gflags::CommandLineFlagInfo_*,_std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

static void FindMatchingFlags(
    const vector<CommandLineFlagInfo> &all_flags,
    const CompletionOptions &options,
    const string &match_token,
    set<const CommandLineFlagInfo *> *all_matches,
    string *longest_common_prefix) {
  all_matches->clear();
  bool first_match = true;
  for (vector<CommandLineFlagInfo>::const_iterator it = all_flags.begin();
      it != all_flags.end();
      ++it) {
    if (DoesSingleFlagMatch(*it, options, match_token)) {
      all_matches->insert(&*it);
      if (first_match) {
        first_match = false;
        *longest_common_prefix = it->name;
      } else {
        if (longest_common_prefix->empty() || it->name.empty()) {
          longest_common_prefix->clear();
          continue;
        }
        string::size_type pos = 0;
        while (pos < longest_common_prefix->size() &&
            pos < it->name.size() &&
            (*longest_common_prefix)[pos] == it->name[pos])
          ++pos;
        longest_common_prefix->erase(pos);
      }
    }
  }
}